

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcConstructionMaterialResource::IfcConstructionMaterialResource
          (IfcConstructionMaterialResource *this)

{
  *(undefined ***)&this->field_0x1b8 = &PTR__Object_008048a0;
  *(undefined8 *)&this->field_0x1c0 = 0;
  *(char **)&this->field_0x1c8 = "IfcConstructionMaterialResource";
  IfcConstructionResource::IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__00895478);
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x180 = 0;
  *(undefined8 *)&this->super_IfcConstructionResource = 0x895370;
  *(undefined8 *)&this->field_0x1b8 = 0x895460;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0x895398;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0x8953c0;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0x8953e8;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x895410;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0x895438;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x188 = 0;
  *(undefined8 *)&this->field_0x190 = 0;
  *(undefined8 *)&this->field_0x191 = 0;
  *(undefined8 *)&this->field_0x199 = 0;
  (this->UsageRatio).have = false;
  return;
}

Assistant:

IfcConstructionMaterialResource() : Object("IfcConstructionMaterialResource") {}